

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

iterator __thiscall
QList<QCommandLineParserPrivate::PositionalArgumentDefinition>::end
          (QList<QCommandLineParserPrivate::PositionalArgumentDefinition> *this)

{
  PositionalArgumentDefinition *n;
  QArrayDataPointer<QCommandLineParserPrivate::PositionalArgumentDefinition> *in_RDI;
  long in_FS_OFFSET;
  QArrayDataPointer<QCommandLineParserPrivate::PositionalArgumentDefinition>
  *in_stack_ffffffffffffffe0;
  iterator local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  detach((QList<QCommandLineParserPrivate::PositionalArgumentDefinition> *)0x6fa3d9);
  QArrayDataPointer<QCommandLineParserPrivate::PositionalArgumentDefinition>::operator->(in_RDI);
  n = QArrayDataPointer<QCommandLineParserPrivate::PositionalArgumentDefinition>::end
                (in_stack_ffffffffffffffe0);
  iterator::iterator(&local_10,n);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (iterator)local_10.i;
  }
  __stack_chk_fail();
}

Assistant:

iterator end() { detach(); return iterator(d->end()); }